

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_removal_reason.cpp
# Opt level: O2

string * RemovalReasonToString_abi_cxx11_(string *__return_storage_ptr__,MemPoolRemovalReason *r)

{
  long in_FS_OFFSET;
  allocator<char> local_16;
  allocator<char> local_15;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  switch(*r) {
  case EXPIRY:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"expiry",&local_11);
    break;
  case SIZELIMIT:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"sizelimit",&local_12);
    break;
  case REORG:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"reorg",&local_13);
    break;
  case BLOCK:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"block",&local_14);
    break;
  case CONFLICT:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"conflict",&local_15);
    break;
  case REPLACED:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"replaced",&local_16);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/kernel/mempool_removal_reason.cpp"
                  ,0x14,"std::string RemovalReasonToString(const MemPoolRemovalReason &)");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RemovalReasonToString(const MemPoolRemovalReason& r) noexcept
{
    switch (r) {
        case MemPoolRemovalReason::EXPIRY: return "expiry";
        case MemPoolRemovalReason::SIZELIMIT: return "sizelimit";
        case MemPoolRemovalReason::REORG: return "reorg";
        case MemPoolRemovalReason::BLOCK: return "block";
        case MemPoolRemovalReason::CONFLICT: return "conflict";
        case MemPoolRemovalReason::REPLACED: return "replaced";
    }
    assert(false);
}